

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kinematics.cc
# Opt level: O2

uint __thiscall
RigidBodyDynamics::InverseKinematicsConstraintSet::AddOrientationConstraint
          (InverseKinematicsConstraintSet *this,uint body_id,Matrix3d *target_orientation,
          float weight)

{
  float local_60;
  uint local_5c;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_58 [8];
  undefined8 local_50;
  ConstraintType local_48 [6];
  
  local_48[0] = ConstraintTypeOrientation;
  local_60 = weight;
  local_5c = body_id;
  std::
  vector<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType,_std::allocator<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType>_>
  ::emplace_back<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType>
            (&this->constraint_type,local_48);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->body_ids,&local_5c);
  local_50 = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_48,local_58);
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::emplace_back<Vector3_t>
            (&this->body_points,(Vector3_t *)local_48);
  local_50 = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_48,local_58);
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::emplace_back<Vector3_t>
            (&this->target_positions,(Vector3_t *)local_48);
  std::vector<Matrix3_t,_std::allocator<Matrix3_t>_>::push_back
            (&this->target_orientations,target_orientation);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (&this->constraint_row_index,&this->num_constraints);
  std::vector<float,_std::allocator<float>_>::push_back(&this->constraint_weight,&local_60);
  this->num_constraints = this->num_constraints + 3;
  return (int)((ulong)((long)(this->constraint_type).
                             super__Vector_base<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType,_std::allocator<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->constraint_type).
                            super__Vector_base<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType,_std::allocator<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 2) - 1;
}

Assistant:

RBDL_DLLAPI
unsigned int InverseKinematicsConstraintSet::AddOrientationConstraint(
    unsigned int body_id,
    const Matrix3d& target_orientation,
    float weight
    ) {
  constraint_type.push_back (ConstraintTypeOrientation);
  body_ids.push_back(body_id);
  body_points.push_back(Vector3d::Zero());
  target_positions.push_back(Vector3d::Zero());
  target_orientations.push_back(target_orientation);
  constraint_row_index.push_back(num_constraints);
  constraint_weight.push_back(weight);
  num_constraints = num_constraints + 3;
  return constraint_type.size() - 1;
}